

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O2

Value * duckdb::EnableProfilingSetting::GetSetting
                  (Value *__return_storage_ptr__,ClientContext *context)

{
  ClientConfig *pCVar1;
  InternalException *this;
  char *val;
  allocator local_51;
  LogicalType local_50;
  string local_38;
  
  pCVar1 = ClientConfig::GetConfig(context);
  if (pCVar1->enable_profiler == false) {
    LogicalType::LogicalType(&local_50,SQLNULL);
    Value::Value(__return_storage_ptr__,&local_50);
    LogicalType::~LogicalType(&local_50);
  }
  else {
    switch(pCVar1->profiler_print_format) {
    case QUERY_TREE:
      val = "query_tree";
      break;
    case JSON:
      val = "json";
      break;
    case QUERY_TREE_OPTIMIZER:
      val = "query_tree_optimizer";
      break;
    case NO_OUTPUT:
      val = "no_output";
      break;
    case HTML:
      val = "html";
      break;
    case GRAPHVIZ:
      val = "graphviz";
      break;
    default:
      this = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_38,"Unsupported profiler print format",&local_51);
      InternalException::InternalException(this,&local_38);
      __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    Value::Value(__return_storage_ptr__,val);
  }
  return __return_storage_ptr__;
}

Assistant:

Value EnableProfilingSetting::GetSetting(const ClientContext &context) {
	auto &config = ClientConfig::GetConfig(context);
	if (!config.enable_profiler) {
		return Value();
	}
	switch (config.profiler_print_format) {
	case ProfilerPrintFormat::JSON:
		return Value("json");
	case ProfilerPrintFormat::QUERY_TREE:
		return Value("query_tree");
	case ProfilerPrintFormat::QUERY_TREE_OPTIMIZER:
		return Value("query_tree_optimizer");
	case ProfilerPrintFormat::NO_OUTPUT:
		return Value("no_output");
	case ProfilerPrintFormat::HTML:
		return Value("html");
	case ProfilerPrintFormat::GRAPHVIZ:
		return Value("graphviz");
	default:
		throw InternalException("Unsupported profiler print format");
	}
}